

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O0

_Bool xdr_opaque_encode(XDR *xdrs,char *cp,u_int cnt)

{
  _Bool _Var1;
  ulong uVar2;
  undefined4 local_2c;
  uint local_28;
  uint32_t zero;
  u_int rndup;
  u_int cnt_local;
  char *cp_local;
  XDR *xdrs_local;
  
  if (cnt == 0) {
    xdrs_local._7_1_ = true;
  }
  else {
    zero = cnt;
    _rndup = cp;
    cp_local = (char *)xdrs;
    _Var1 = (*xdrs->x_ops->x_putbytes)(xdrs,cp,cnt);
    if (_Var1) {
      local_28 = zero & 3;
      if (local_28 != 0) {
        local_2c = 0;
        uVar2 = (**(code **)(*(long *)cp_local + 0x18))(cp_local,&local_2c,4 - local_28);
        if ((uVar2 & 1) == 0) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR zero","xdr_opaque_encode",0x1f8);
          }
          return false;
        }
      }
      xdrs_local._7_1_ = true;
    }
    else {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR opaque","xdr_opaque_encode",0x1e8);
      }
      xdrs_local._7_1_ = false;
    }
  }
  return xdrs_local._7_1_;
}

Assistant:

static inline bool
xdr_opaque_encode(XDR *xdrs, const char *cp, u_int cnt)
{
	u_int rndup;

	/*
	 * if no data we are done
	 */
	if (cnt == 0)
		return (true);

	/*
	 * XDR_INLINE is just as likely to do a function call,
	 * so don't bother with it here.
	 */
	if (!XDR_PUTBYTES(xdrs, cp, cnt)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR opaque",
			__func__, __LINE__);
		return (false);
	}

	/*
	 * round byte count to full xdr units
	 */
	rndup = cnt & (BYTES_PER_XDR_UNIT - 1);

	if (rndup > 0) {
		uint32_t zero = 0;

		if (!XDR_PUTBYTES(xdrs, (char *) &zero,
				  BYTES_PER_XDR_UNIT - rndup)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR zero",
				__func__, __LINE__);
			return (false);
		}
	}

	return (true);
}